

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O2

void nn_streamhdr_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint16_t uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  nn_iovec iovec;
  
  uVar5 = (ulong)(uint)src;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_timer_start((nn_timer *)&self[1].shutdown_fn,1000);
        iovec.iov_base = &self[4].shutdown_fn;
        iovec.iov_len = 8;
        nn_usock_send((nn_usock *)self[3].stopped.srcptr,&iovec,1);
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 0xfffffffffffffffe;
      uVar6 = 0xa5;
    }
    else {
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected source";
      uVar6 = 0xa9;
    }
    break;
  case 2:
    if (src == 2) {
      if (type == 1) goto LAB_0012ba33;
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0xcb;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012ba33;
      if (type == 3) {
        nn_usock_recv((nn_usock *)self[3].stopped.srcptr,&self[4].shutdown_fn,8,(int *)0x0);
        *(undefined4 *)&self[1].fn = 3;
        return;
      }
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 1;
      uVar6 = 0xc1;
    }
    else {
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected source";
      uVar6 = 0xcf;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 1) goto LAB_0012ba33;
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0xf9;
    }
    else {
      if (src == 1) {
        if (type == 8) {
          return;
        }
        if (type == 5) {
LAB_0012ba33:
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 4;
          return;
        }
        if (type == 4) {
          if (*(int *)&self[4].shutdown_fn == 0x505300) {
            uVar1 = nn_gets((uint8_t *)((long)&self[4].shutdown_fn + 4));
            iVar2 = nn_pipebase_ispeer((nn_pipebase *)self[4].fn,(uint)uVar1);
            if (iVar2 != 0) {
              nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
              *(undefined4 *)&self[1].fn = 5;
              return;
            }
          }
          goto LAB_0012ba33;
        }
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xef);
        goto LAB_0012bd46;
      }
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected source";
      uVar6 = 0xfd;
    }
    break;
  case 4:
    if (src == 1) {
      return;
    }
    if (src == 2) {
      if (type == 2) {
        nn_usock_swap_owner((nn_usock *)self[3].stopped.srcptr,(nn_fsm_owner *)&self[3].stopped.type
                           );
        self[3].stopped.srcptr = (void *)0x0;
        self[3].stopped.type = -1;
        self[3].stopped.item.next = (nn_queue_item *)0x0;
        *(undefined4 *)&self[1].fn = 6;
        iVar2 = 2;
LAB_0012b98c:
        nn_fsm_raise(self,(nn_fsm_event *)&self[4].state,iVar2);
        return;
      }
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0x117;
    }
    else {
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected source";
      uVar6 = 0x11b;
    }
    break;
  case 5:
    if (src == 1) {
      return;
    }
    if (src == 2) {
      if (type == 2) {
        nn_usock_swap_owner((nn_usock *)self[3].stopped.srcptr,(nn_fsm_owner *)&self[3].stopped.type
                           );
        self[3].stopped.srcptr = (void *)0x0;
        self[3].stopped.type = -1;
        self[3].stopped.item.next = (nn_queue_item *)0x0;
        *(undefined4 *)&self[1].fn = 6;
        iVar2 = 1;
        goto LAB_0012b98c;
      }
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0x134;
    }
    else {
      nn_backtrace_print();
      uVar3 = (ulong)*(uint *)&self[1].fn;
      pcVar4 = "Unexpected source";
      uVar6 = 0x138;
    }
    break;
  case 6:
    nn_backtrace_print();
    uVar3 = (ulong)*(uint *)&self[1].fn;
    pcVar4 = "Unexpected source";
    uVar6 = 0x141;
    break;
  default:
    nn_backtrace_print();
    uVar3 = (ulong)*(uint *)&self[1].fn;
    pcVar4 = "Unexpected state";
    uVar6 = 0x147;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar4,uVar3,uVar5,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
          ,uVar6);
LAB_0012bd46:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_streamhdr_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_streamhdr *streamhdr;
    struct nn_iovec iovec;
    int protocol;

    streamhdr = nn_cont (self, struct nn_streamhdr, fsm);


    switch (streamhdr->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_timer_start (&streamhdr->timer, 1000);
                iovec.iov_base = streamhdr->protohdr;
                iovec.iov_len = sizeof (streamhdr->protohdr);
                nn_usock_send (streamhdr->usock, &iovec, 1);
                streamhdr->state = NN_STREAMHDR_STATE_SENDING;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  SENDING state.                                                            */
/******************************************************************************/
    case NN_STREAMHDR_STATE_SENDING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                nn_usock_recv (streamhdr->usock, streamhdr->protohdr,
                    sizeof (streamhdr->protohdr), NULL);
                streamhdr->state = NN_STREAMHDR_STATE_RECEIVING;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  RECEIVING state.                                                          */
/******************************************************************************/
    case NN_STREAMHDR_STATE_RECEIVING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:

                /*  Here we are checking whether the peer speaks the same
                    protocol as this socket. */
                if (memcmp (streamhdr->protohdr, "\0SP\0", 4) != 0)
                    goto invalidhdr;
                protocol = nn_gets (streamhdr->protohdr + 4);
                if (!nn_pipebase_ispeer (streamhdr->pipebase, protocol))
                    goto invalidhdr;
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
invalidhdr:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_assert (0);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping, but there
                is only a subset of events that are plausible. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_ERROR);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_OK);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_STREAMHDR_STATE_DONE:
        nn_fsm_bad_source (streamhdr->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (streamhdr->state, src, type);
    }
}